

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LagrangePolynomial.cpp
# Opt level: O2

int64_t __thiscall
LagrangePolynomial::find_product(LagrangePolynomial *this,vector<int,_std::allocator<int>_> *data)

{
  pointer piVar1;
  int64_t iVar2;
  long lVar3;
  
  piVar1 = (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar2 = 1;
  for (lVar3 = 0;
      (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish - (long)piVar1 >> 2 != lVar3; lVar3 = lVar3 + 1) {
    iVar2 = iVar2 * piVar1[lVar3];
  }
  return iVar2;
}

Assistant:

int64_t LagrangePolynomial::find_product(vector<int> data) {
    // returns product of vector<int> data
    // used to find the product of all denominators of the basis polynomial
    int64_t  result = 1;

    for(int i=0; i<data.size(); i++){
        result = result * data[i];
    }
    return result;
}